

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::leU(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  ulong uVar2;
  BasicType BVar3;
  bool bVar4;
  bool bVar5;
  
  BVar3 = wasm::Type::getBasic(&this->type);
  if (BVar3 == i64) {
    uVar1 = (this->field_0).func.super_IString.str._M_len;
    uVar2 = (other->field_0).func.super_IString.str._M_len;
    bVar4 = uVar1 < uVar2;
    bVar5 = uVar1 == uVar2;
  }
  else {
    if (BVar3 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x574);
    }
    bVar4 = (uint)(this->field_0).i32 < (uint)(other->field_0).i32;
    bVar5 = (this->field_0).i32 == (other->field_0).i32;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(bVar4 || bVar5);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::leU(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) <= uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) <= uint64_t(other.i64));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}